

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

int merged(int lA,int lB)

{
  long lVar1;
  int iVar2;
  instrStruct *piVar3;
  
  if (lA != 0) {
    iVar2 = 0;
    if (0 < lA) {
      iVar2 = lA;
    }
    iVar2 = iVar2 + 1;
    piVar3 = firstInstr;
    do {
      piVar3 = piVar3->next;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    lVar1 = (long)piVar3->instr % (long)bigNum;
    iVar2 = (int)lVar1;
    while (iVar2 != 0) {
      iVar2 = (int)lVar1;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      iVar2 = iVar2 + 1;
      piVar3 = firstInstr;
      do {
        piVar3 = piVar3->next;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      lVar1 = (long)piVar3->instr % (long)bigNum;
      iVar2 = (int)lVar1;
    }
    piVar3->instr = piVar3->instr + lB;
    lB = lA;
  }
  return lB;
}

Assistant:

procedure 
int merged(int lA, int lB) {
	variable int lC; variable int lD;
	variable struct instrStruct *element;
	lC = 0; lD = 0;
	if (lA != 0) {
		lC = lA;
		element = getInstruction(lC);
		lD = element->instr % bigNum;
		while (lD != 0) {
			lC = lD;
			element = getInstruction(lC);
			lD = element->instr % bigNum;
		}
		element->instr = element->instr - lD + lB;
		return lA;
	}
	return lB;
}